

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void __thiscall cmSystemTools::EnvDiff::ApplyToCurrentEnv(EnvDiff *this,ostringstream *measurement)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string env_update;
  string local_d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined8 local_88;
  _Base_ptr local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  p_Var2 = *(_Rb_tree_node_base **)&this->field_0x18;
  if (p_Var2 != (_Rb_tree_node_base *)&this->field_0x8) {
    do {
      if ((char)p_Var2[3]._M_color == _S_black) {
        local_b0.first._M_str = *(char **)(p_Var2 + 1);
        local_b0.first._M_len = (size_t)p_Var2[1]._M_parent;
        local_b0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_68 = 0;
        local_60 = 1;
        local_90 = local_50;
        local_50[0] = 0x3d;
        local_98 = 1;
        local_88 = 0;
        local_78 = *(undefined8 *)(p_Var2 + 2);
        local_80 = p_Var2[2]._M_parent;
        local_70 = 0;
        views._M_len = 3;
        views._M_array = &local_b0;
        local_58 = local_90;
        cmCatViews(&local_d0,views);
        cmsys::SystemTools::PutEnv(&local_d0);
        if (measurement != (ostringstream *)0x0) {
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)measurement,local_d0._M_dataplus._M_p,
                              local_d0._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        unsetenv(*(char **)(p_Var2 + 1));
        if (measurement != (ostringstream *)0x0) {
          local_b0.first._M_len = CONCAT71(local_b0.first._M_len._1_7_,0x23);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)measurement,(char *)&local_b0,1);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\n",2);
        }
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)&this->field_0x8);
  }
  return;
}

Assistant:

void cmSystemTools::EnvDiff::ApplyToCurrentEnv(std::ostringstream* measurement)
{
  for (auto const& env_apply : diff) {
    if (env_apply.second) {
      auto const env_update =
        cmStrCat(env_apply.first, '=', *env_apply.second);
      cmSystemTools::PutEnv(env_update);
      if (measurement) {
        *measurement << env_update << std::endl;
      }
    } else {
      cmSystemTools::UnsetEnv(env_apply.first.c_str());
      if (measurement) {
        // Signify that this variable is being actively unset
        *measurement << '#' << env_apply.first << "=\n";
      }
    }
  }
}